

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::Scanner::skipComment(Scanner *this)

{
  char *Position;
  
  Position = this->Current;
  if (*Position == '#') {
    while (Position = skip_nb_char(this,Position), Position != this->Current) {
      this->Current = Position;
      this->Column = this->Column + 1;
    }
  }
  return;
}

Assistant:

void Scanner::skipComment() {
  if (*Current != '#')
    return;
  while (true) {
    // This may skip more than one byte, thus Column is only incremented
    // for code points.
    StringRef::iterator I = skip_nb_char(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }
}